

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::set_seed(torrent *this,torrent_peer *p,bool s)

{
  if (((p->field_0x1b & 0x80) == 0) != s) {
    return;
  }
  this->m_num_seeds = this->m_num_seeds + (s - 1 | 1);
  need_peer_list(this);
  peer_list::set_seed((this->super_torrent_hot_members).m_peer_list._M_t.
                      super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                      .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,p,s);
  update_auto_sequential(this);
  return;
}

Assistant:

void torrent::set_seed(torrent_peer* p, bool const s)
	{
		if (bool(p->seed) == s) return;
		if (s)
		{
			TORRENT_ASSERT(m_num_seeds < 0xffff);
			++m_num_seeds;
		}
		else
		{
			TORRENT_ASSERT(m_num_seeds > 0);
			--m_num_seeds;
		}

		need_peer_list();
		m_peer_list->set_seed(p, s);
		update_auto_sequential();
	}